

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

PtexFaceData * __thiscall
Ptex::v2_2::PtexReader::TiledReducedFace::getTile(TiledReducedFace *this,int tile)

{
  size_t *psVar1;
  Res RVar2;
  DataType DVar3;
  TiledFaceBase *pTVar4;
  _func_int *p_Var5;
  code *pcVar6;
  long lVar7;
  ReduceFn *pRVar8;
  TiledReducedFace *pTVar9;
  char cVar10;
  int iVar11;
  undefined4 extraout_var;
  void *pvVar13;
  void *__s2;
  FaceData *pFVar14;
  _func_int **pp_Var15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int i;
  uint uVar20;
  pointer ppFVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  bool bVar25;
  undefined8 uStack_b0;
  DataType aDStack_a8 [2];
  ulong auStack_a0 [2];
  ReduceFn *local_90;
  FaceData *local_88;
  ulong local_80;
  long local_78;
  pointer local_70;
  int local_64;
  int local_60;
  int local_5c;
  TiledReducedFace *local_58;
  undefined8 *local_50;
  int local_44;
  int local_40;
  uint local_3c;
  int local_38;
  int local_34;
  long *plVar12;
  
  lVar24 = (long)tile;
  ppFVar21 = (this->super_TiledFaceBase)._tiles.
             super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppFVar21[lVar24] != (FaceData *)0x0) {
    return &ppFVar21[lVar24]->super_PtexFaceData;
  }
  iVar11 = this->_parentface->_ntilesu;
  iVar23 = (this->super_TiledFaceBase)._ntilesu;
  iVar19 = iVar11 / iVar23;
  local_38 = this->_parentface->_ntilesv / (this->super_TiledFaceBase)._ntilesv;
  uVar17 = local_38 * iVar19;
  lVar7 = -((long)(int)uVar17 * 8 + 0xfU & 0xfffffffffffffff0);
  local_50 = (undefined8 *)((long)auStack_a0 + lVar7 + 8);
  local_58 = this;
  if (0 < (int)uVar17) {
    uVar20 = (tile % iVar23) * iVar19 + (tile / iVar23) * local_38 * iVar11;
    local_34 = (iVar11 - iVar19) + 1;
    local_80 = (ulong)uVar17;
    bVar25 = true;
    uVar22 = 0;
    local_78 = lVar24;
    local_70 = ppFVar21;
    local_40 = iVar19;
    do {
      pTVar4 = this->_parentface;
      p_Var5 = (pTVar4->super_FaceData).super_PtexFaceData._vptr_PtexFaceData[9];
      *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b8152;
      iVar11 = (*p_Var5)(pTVar4,(ulong)uVar20);
      plVar12 = (long *)CONCAT44(extraout_var,iVar11);
      local_50[uVar22] = plVar12;
      if (bVar25) {
        pcVar6 = *(code **)(*plVar12 + 0x18);
        *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b816c;
        cVar10 = (*pcVar6)(plVar12);
        if (cVar10 == '\0') goto LAB_003b81a8;
        if (uVar22 == 0) {
          bVar25 = true;
        }
        else {
          pcVar6 = *(code **)(*(long *)*local_50 + 0x30);
          *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b8182;
          pvVar13 = (void *)(*pcVar6)();
          pcVar6 = *(code **)(*plVar12 + 0x30);
          *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b818e;
          __s2 = (void *)(*pcVar6)(plVar12);
          iVar11 = (this->super_TiledFaceBase)._pixelsize;
          *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b81a0;
          iVar11 = bcmp(pvVar13,__s2,(long)iVar11);
          bVar25 = iVar11 == 0;
        }
      }
      else {
LAB_003b81a8:
        bVar25 = false;
      }
      iVar11 = local_40;
      uVar22 = uVar22 + 1;
      iVar23 = local_34;
      if ((int)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff) %
               (long)local_40) != 0) {
        iVar23 = 1;
      }
      uVar20 = uVar20 + iVar23;
    } while (local_80 != uVar22);
    ppFVar21 = local_70;
    lVar24 = local_78;
    if (!bVar25) {
      iVar23 = (this->super_TiledFaceBase)._pixelsize;
      bVar16 = (this->super_TiledFaceBase)._tileres.vlog2;
      local_3c = (uint)bVar16;
      iVar19 = ((1 << ((this->super_TiledFaceBase)._tileres.ulog2 & 0x1fU)) << (bVar16 & 0x1f)) *
               iVar23;
      *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b8277;
      pFVar14 = (FaceData *)operator_new(0x18);
      pFVar14->_res = (this->super_TiledFaceBase)._tileres;
      (pFVar14->super_PtexFaceData)._vptr_PtexFaceData = (_func_int **)&PTR__PackedFace_02d15628;
      *(int *)&pFVar14->field_0xc = iVar23;
      local_44 = iVar19;
      local_34 = iVar23;
      *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b82a4;
      pp_Var15 = (_func_int **)operator_new__((long)iVar19);
      pFVar14[1].super_PtexFaceData._vptr_PtexFaceData = pp_Var15;
      RVar2 = this->_parentface->_tileres;
      bVar16 = RVar2.ulog2;
      local_60 = 1 << (bVar16 & 0x1f);
      local_64 = 1 << (RVar2.vlog2 & 0x1fU);
      local_5c = local_34 << (bVar16 & 0x1f);
      iVar23 = local_34 << ((this->super_TiledFaceBase)._tileres.ulog2 & 0x1fU);
      local_34 = iVar23 / iVar11;
      local_3c = (iVar23 << ((byte)local_3c & 0x1f)) / local_38 - (iVar11 + -1) * local_34;
      uVar22 = 0;
      local_88 = pFVar14;
      do {
        plVar12 = (long *)local_50[uVar22];
        pcVar6 = *(code **)(*plVar12 + 0x18);
        *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b8326;
        cVar10 = (*pcVar6)(plVar12);
        pTVar9 = local_58;
        if (cVar10 == '\0') {
          local_90 = local_58->_reducefn;
          pcVar6 = *(code **)(*plVar12 + 0x30);
          *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b8389;
          pvVar13 = (void *)(*pcVar6)(plVar12);
          iVar18 = local_5c;
          iVar19 = local_60;
          iVar11 = local_64;
          DVar3 = (pTVar9->super_TiledFaceBase)._dt;
          *(ulong *)((long)auStack_a0 + lVar7) = (ulong)(uint)(pTVar9->super_TiledFaceBase)._nchan;
          *(ulong *)((long)aDStack_a8 + lVar7) = (ulong)DVar3;
          pRVar8 = local_90;
          *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x3b83ad;
          (*pRVar8)(pvVar13,iVar18,iVar19,iVar11,pp_Var15,iVar23,
                    *(DataType *)((long)aDStack_a8 + lVar7),*(int *)((long)auStack_a0 + lVar7));
          iVar11 = local_40;
        }
        else {
          pcVar6 = *(code **)(*plVar12 + 0x30);
          *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b8333;
          pvVar13 = (void *)(*pcVar6)(plVar12);
          bVar16 = (local_58->super_TiledFaceBase)._tileres.ulog2;
          iVar18 = (1 << ((local_58->super_TiledFaceBase)._tileres.vlog2 & 0x1fU)) / local_38;
          iVar19 = (local_58->super_TiledFaceBase)._pixelsize;
          *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b836f;
          PtexUtils::fill(pvVar13,pp_Var15,iVar23,(1 << (bVar16 & 0x1f)) / iVar11,iVar18,iVar19);
        }
        uVar22 = uVar22 + 1;
        uVar17 = local_34;
        if ((int)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff) %
                 (long)iVar11) == 0) {
          uVar17 = local_3c;
        }
        pp_Var15 = (_func_int **)((long)pp_Var15 + (long)(int)uVar17);
        ppFVar21 = local_70;
        pFVar14 = local_88;
        lVar24 = local_78;
      } while (local_80 != uVar22);
      goto LAB_003b83e3;
    }
  }
  *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b81f3;
  pFVar14 = (FaceData *)operator_new(0x18);
  local_44 = (this->super_TiledFaceBase)._pixelsize;
  (pFVar14->_res).ulog2 = '\0';
  (pFVar14->_res).vlog2 = '\0';
  (pFVar14->super_PtexFaceData)._vptr_PtexFaceData = (_func_int **)&PTR__PackedFace_02d15628;
  *(int *)&pFVar14->field_0xc = local_44;
  uVar22 = (ulong)local_44;
  *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b821a;
  pp_Var15 = (_func_int **)operator_new__(uVar22);
  pFVar14[1].super_PtexFaceData._vptr_PtexFaceData = pp_Var15;
  (pFVar14->super_PtexFaceData)._vptr_PtexFaceData = (_func_int **)&PTR__PackedFace_02d156a8;
  pcVar6 = *(code **)(*(long *)*local_50 + 0x30);
  *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b8239;
  pvVar13 = (void *)(*pcVar6)();
  iVar11 = (this->super_TiledFaceBase)._pixelsize;
  *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b8248;
  memcpy(pp_Var15,pvVar13,(long)iVar11);
LAB_003b83e3:
  LOCK();
  bVar25 = ppFVar21[lVar24] == (FaceData *)0x0;
  if (bVar25) {
    ppFVar21[lVar24] = pFVar14;
  }
  UNLOCK();
  if (bVar25) {
    if ((long)local_44 + 0x18 != 0) {
      LOCK();
      psVar1 = &((local_58->super_TiledFaceBase)._reader)->_memUsed;
      *psVar1 = *psVar1 + (long)local_44 + 0x18;
      UNLOCK();
    }
  }
  else {
    p_Var5 = (pFVar14->super_PtexFaceData)._vptr_PtexFaceData[1];
    *(undefined8 *)((long)auStack_a0 + lVar7) = 0x3b8413;
    (*p_Var5)(pFVar14);
  }
  return &ppFVar21[lVar24]->super_PtexFaceData;
}

Assistant:

PtexFaceData* PtexReader::TiledReducedFace::getTile(int tile)
{
    FaceData*& face = _tiles[tile];
    if (face) {
        return face;
    }

    // first, get all parent tiles for this tile
    // and check if they are constant (with the same value)
    int pntilesu = _parentface->ntilesu();
    int pntilesv = _parentface->ntilesv();
    int nu = pntilesu / _ntilesu; // num parent tiles for this tile in u dir
    int nv = pntilesv / _ntilesv; // num parent tiles for this tile in v dir

    int ntilesval = nu*nv; // num parent tiles for this tile
    PtexFaceData** tiles = (PtexFaceData**) alloca(ntilesval * sizeof(PtexFaceData*));
    bool allConstant = true;
    int ptile = (tile/_ntilesu) * nv * pntilesu + (tile%_ntilesu) * nu;
    for (int i = 0; i < ntilesval;) {
        PtexFaceData* tileval = tiles[i] = _parentface->getTile(ptile);
        allConstant = (allConstant && tileval->isConstant() &&
                       (i==0 || (0 == memcmp(tiles[0]->getData(), tileval->getData(),
                                             _pixelsize))));
        i++;
        ptile += (i%nu)? 1 : pntilesu - nu + 1;
    }

    FaceData* newface = 0;
    size_t newMemUsed = 0;
    if (allConstant) {
        // allocate a new constant face
        newface = new ConstantFace(_pixelsize);
        newMemUsed = sizeof(ConstantFace) + _pixelsize;
        memcpy(newface->getData(), tiles[0]->getData(), _pixelsize);
    }
    else {
        // allocate a new packed face for the tile
        int memsize = _pixelsize*_tileres.size();
        newface = new PackedFace(_tileres, _pixelsize, memsize);
        newMemUsed = sizeof(PackedFace) + memsize;

        // generate reduction from parent tiles
        int ptileures = _parentface->tileres().u();
        int ptilevres = _parentface->tileres().v();
        int sstride = ptileures * _pixelsize;
        int dstride = _tileres.u() * _pixelsize;
        int dstepu = dstride/nu;
        int dstepv = dstride*_tileres.v()/nv - dstepu*(nu-1);

        char* dst = (char*) newface->getData();
        for (int i = 0; i < ntilesval;) {
            PtexFaceData* tileval = tiles[i];
            if (tileval->isConstant())
                PtexUtils::fill(tileval->getData(), dst, dstride,
                                _tileres.u()/nu, _tileres.v()/nv,
                                _pixelsize);
            else
                _reducefn(tileval->getData(), sstride, ptileures, ptilevres,
                          dst, dstride, _dt, _nchan);
            i++;
            dst += (i%nu) ? dstepu : dstepv;
        }
    }

    if (!AtomicCompareAndSwap(&face, (FaceData*)0, newface)) {
        delete newface;
    }
    else {
        _reader->increaseMemUsed(newMemUsed);
    }

    return face;
}